

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_optimize.cc
# Opt level: O0

void __thiscall pass_remove_empty_switch_one_Test::TestBody(pass_remove_empty_switch_one_Test *this)

{
  undefined1 var [8];
  bool bVar1;
  Generator *this_00;
  Var *pVVar2;
  element_type *peVar3;
  element_type *this_01;
  map<std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
  *this_02;
  char *message;
  AssertHelper local_270;
  Message local_268;
  int local_25c;
  size_type local_258;
  undefined1 local_250 [8];
  AssertionResult gtest_ar;
  shared_ptr<kratos::ScopedStmtBlock> local_230;
  shared_ptr<kratos::Stmt> local_220;
  undefined1 local_210 [16];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [8];
  shared_ptr<kratos::SwitchStmt> case_;
  shared_ptr<kratos::SequentialStmtBlock> seq;
  string local_198;
  undefined1 local_178 [8];
  Var *out;
  allocator<char> local_159;
  string local_158;
  __node_base local_138;
  Generator *mod;
  Context c;
  pass_remove_empty_switch_one_Test *this_local;
  
  c.tracked_generators_._M_h._M_single_bucket = (__node_base_ptr)this;
  kratos::Context::Context((Context *)&mod);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"mod",&local_159);
  this_00 = kratos::Context::generator((Context *)&mod,&local_158);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator(&local_159);
  local_138._M_nxt = (_Hash_node_base *)this_00;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_198,"out",
             (allocator<char> *)
             ((long)&seq.super___shared_ptr<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi + 7));
  pVVar2 = kratos::Generator::var(this_00,&local_198,1);
  std::__cxx11::string::~string((string *)&local_198);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&seq.super___shared_ptr<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi + 7));
  local_178 = (undefined1  [8])pVVar2;
  kratos::Generator::sequential
            ((Generator *)
             &case_.super___shared_ptr<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::enable_shared_from_this<kratos::Var>::shared_from_this
            ((enable_shared_from_this<kratos::Var> *)(local_1e0 + 0x10));
  std::make_shared<kratos::SwitchStmt,std::shared_ptr<kratos::Var>>
            ((shared_ptr<kratos::Var> *)local_1c0);
  std::shared_ptr<kratos::Var>::~shared_ptr((shared_ptr<kratos::Var> *)(local_1e0 + 0x10));
  peVar3 = std::__shared_ptr_access<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_1c0);
  kratos::constant(0,1,false);
  kratos::Var::as<kratos::Const>((Var *)local_1e0);
  var = local_178;
  kratos::constant(0,1,false);
  kratos::Var::assign((Var *)local_200,(Var *)var);
  std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::AssignStmt,void>
            ((shared_ptr<kratos::Stmt> *)(local_200 + 0x10),
             (shared_ptr<kratos::AssignStmt> *)local_200);
  kratos::SwitchStmt::add_switch_case
            (peVar3,(shared_ptr<kratos::Const> *)local_1e0,
             (shared_ptr<kratos::Stmt> *)(local_200 + 0x10));
  std::shared_ptr<kratos::Stmt>::~shared_ptr((shared_ptr<kratos::Stmt> *)(local_200 + 0x10));
  std::shared_ptr<kratos::AssignStmt>::~shared_ptr((shared_ptr<kratos::AssignStmt> *)local_200);
  std::shared_ptr<kratos::Const>::~shared_ptr((shared_ptr<kratos::Const> *)local_1e0);
  peVar3 = std::__shared_ptr_access<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_1c0);
  kratos::constant(1,1,false);
  kratos::Var::as<kratos::Const>((Var *)local_210);
  std::make_shared<kratos::ScopedStmtBlock>();
  std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::ScopedStmtBlock,void>(&local_220,&local_230);
  kratos::SwitchStmt::add_switch_case(peVar3,(shared_ptr<kratos::Const> *)local_210,&local_220);
  std::shared_ptr<kratos::Stmt>::~shared_ptr(&local_220);
  std::shared_ptr<kratos::ScopedStmtBlock>::~shared_ptr(&local_230);
  std::shared_ptr<kratos::Const>::~shared_ptr((shared_ptr<kratos::Const> *)local_210);
  this_01 = std::
            __shared_ptr_access<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&case_.
                             super___shared_ptr<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount);
  std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::SwitchStmt,void>
            ((shared_ptr<kratos::Stmt> *)&gtest_ar.message_,
             (shared_ptr<kratos::SwitchStmt> *)local_1c0);
  kratos::StmtBlock::add_stmt
            (&this_01->super_StmtBlock,(shared_ptr<kratos::Stmt> *)&gtest_ar.message_);
  std::shared_ptr<kratos::Stmt>::~shared_ptr((shared_ptr<kratos::Stmt> *)&gtest_ar.message_);
  kratos::remove_empty_block((Generator *)local_138._M_nxt);
  peVar3 = std::__shared_ptr_access<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_1c0);
  this_02 = kratos::SwitchStmt::body(peVar3);
  local_258 = std::
              map<std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
              ::size(this_02);
  local_25c = 1;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_250,"case_->body().size()","1",&local_258,&local_25c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_250);
  if (!bVar1) {
    testing::Message::Message(&local_268);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_250);
    testing::internal::AssertHelper::AssertHelper
              (&local_270,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_optimize.cc"
               ,0x176,message);
    testing::internal::AssertHelper::operator=(&local_270,&local_268);
    testing::internal::AssertHelper::~AssertHelper(&local_270);
    testing::Message::~Message(&local_268);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_250);
  std::shared_ptr<kratos::SwitchStmt>::~shared_ptr((shared_ptr<kratos::SwitchStmt> *)local_1c0);
  std::shared_ptr<kratos::SequentialStmtBlock>::~shared_ptr
            ((shared_ptr<kratos::SequentialStmtBlock> *)
             &case_.super___shared_ptr<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  kratos::Context::~Context((Context *)&mod);
  return;
}

Assistant:

TEST(pass, remove_empty_switch_one) {  // NOLINT
    Context c;
    auto &mod = c.generator("mod");
    auto &out = mod.var("out", 1);
    auto seq = mod.sequential();
    auto case_ = std::make_shared<SwitchStmt>(out.shared_from_this());
    case_->add_switch_case(constant(0, 1).as<Const>(), out.assign(constant(0, 1)));
    case_->add_switch_case(constant(1, 1).as<Const>(), std::make_shared<ScopedStmtBlock>());
    seq->add_stmt(case_);
    remove_empty_block(&mod);
    EXPECT_EQ(case_->body().size(), 1);
}